

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_statistics.cpp
# Opt level: O3

void __thiscall duckdb::ColumnStatistics::Serialize(ColumnStatistics *this,Serializer *serializer)

{
  _Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_> _Var1;
  _Head_base<0UL,_duckdb::DistinctStatistics_*,_false> _Var2;
  pointer *__ptr_1;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::DistinctStatistics_*,_false> local_18;
  
  Serializer::WriteProperty<duckdb::BaseStatistics>(serializer,100,"statistics",&this->stats);
  local_18._M_head_impl = (DistinctStatistics *)0x0;
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>>
            (serializer,0x65,"distinct",&this->distinct_stats,
             (unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
              *)&local_18);
  _Var2._M_head_impl = local_18._M_head_impl;
  if (local_18._M_head_impl != (DistinctStatistics *)0x0) {
    _Var1.super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl =
         ((local_18._M_head_impl)->log).
         super_unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>._M_t.
         super___uniq_ptr_impl<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_>.
         super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>;
    if (_Var1.super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl != (HyperLogLog *)0x0
       ) {
      operator_delete((void *)_Var1.super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl
                     );
    }
    operator_delete(_Var2._M_head_impl);
  }
  return;
}

Assistant:

void ColumnStatistics::Serialize(Serializer &serializer) const {
	serializer.WriteProperty(100, "statistics", stats);
	serializer.WritePropertyWithDefault(101, "distinct", distinct_stats, unique_ptr<DistinctStatistics>());
}